

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * LoadImage(Image *__return_storage_ptr__,char *fileName)

{
  uchar *fileData;
  char *fileType;
  uint fileSize;
  uint local_1c;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  local_1c = 0;
  fileData = LoadFileData(fileName,&local_1c);
  if (fileData != (uchar *)0x0) {
    fileType = GetFileExtension(fileName);
    LoadImageFromMemory(__return_storage_ptr__,fileType,fileData,local_1c);
    if (__return_storage_ptr__->data == (void *)0x0) {
      TraceLog(4,"IMAGE: [%s] Failed to load data",fileName);
    }
    else {
      TraceLog(3,"IMAGE: [%s] Data loaded successfully (%ix%i)",fileName,
               (ulong)(uint)__return_storage_ptr__->width,
               (ulong)(uint)__return_storage_ptr__->height);
    }
    free(fileData);
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImage(const char *fileName)
{
    Image image = { 0 };

#if defined(SUPPORT_FILEFORMAT_PNG) || \
    defined(SUPPORT_FILEFORMAT_BMP) || \
    defined(SUPPORT_FILEFORMAT_TGA) || \
    defined(SUPPORT_FILEFORMAT_JPG) || \
    defined(SUPPORT_FILEFORMAT_GIF) || \
    defined(SUPPORT_FILEFORMAT_PIC) || \
    defined(SUPPORT_FILEFORMAT_HDR) || \
    defined(SUPPORT_FILEFORMAT_PSD)
#define STBI_REQUIRED
#endif

    // Loading file to memory
    unsigned int fileSize = 0;
    unsigned char *fileData = LoadFileData(fileName, &fileSize);

    if (fileData != NULL)
    {
        // Loading image from memory data
        image = LoadImageFromMemory(GetFileExtension(fileName), fileData, fileSize);

        if (image.data != NULL) TRACELOG(LOG_INFO, "IMAGE: [%s] Data loaded successfully (%ix%i)", fileName, image.width, image.height);
        else TRACELOG(LOG_WARNING, "IMAGE: [%s] Failed to load data", fileName);

        RL_FREE(fileData);
    }

    return image;
}